

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O2

void aom_lowbd_blend_a64_d16_mask_c
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  char cVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  
  cVar12 = (char)conv_params->round_1 + (char)conv_params->round_0;
  iVar6 = (-1 << (0x15U - cVar12 & 0x1f)) + (-1 << (0x16U - cVar12 & 0x1f));
  bVar5 = 0xe - cVar12;
  if (subh == 0 && subw == 0) {
    uVar7 = 0;
    if (w < 1) {
      w = uVar7;
    }
    if (h < 1) {
      h = uVar7;
    }
    uVar15 = 0;
    uVar1 = 0;
    uVar11 = 0;
    for (uVar13 = 0; uVar16 = (ulong)(uint)w, uVar10 = uVar7, uVar8 = uVar15, uVar3 = uVar1,
        uVar2 = uVar11, uVar13 != h; uVar13 = uVar13 + 1) {
      while( true ) {
        if (uVar16 == 0) break;
        iVar9 = ((int)((uint)src1[uVar3] * (0x40 - (uint)mask[uVar10]) +
                      (uint)src0[uVar8] * (uint)mask[uVar10]) >> 6) +
                ((1 << (bVar5 & 0x1f)) >> 1) + iVar6;
        if (iVar9 >> (bVar5 & 0x1f) < 1) {
          iVar9 = 0;
        }
        iVar9 = iVar9 >> (bVar5 & 0x1f);
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        dst[uVar2] = (uint8_t)iVar9;
        uVar16 = uVar16 - 1;
        uVar10 = uVar10 + 1;
        uVar8 = uVar8 + 1;
        uVar3 = uVar3 + 1;
        uVar2 = uVar2 + 1;
      }
      uVar11 = uVar11 + dst_stride;
      uVar1 = uVar1 + src1_stride;
      uVar15 = uVar15 + src0_stride;
      uVar7 = uVar7 + mask_stride;
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    uVar7 = 0;
    if (w < 1) {
      w = uVar7;
    }
    if (h < 1) {
      h = uVar7;
    }
    iVar9 = mask_stride * 2;
    uVar1 = 0;
    uVar11 = 0;
    iVar4 = 0;
    for (uVar13 = 0; uVar13 != h; uVar13 = uVar13 + 1) {
      uVar2 = uVar1;
      uVar10 = uVar11;
      uVar15 = uVar7;
      for (uVar16 = 0; (uint)(w * 2) != uVar16; uVar16 = uVar16 + 2) {
        iVar14 = (int)uVar16;
        uVar8 = (uint)mask[mask_stride + iVar14 + 1] +
                (uint)mask[iVar4 + iVar14 + 1] +
                (uint)mask[mask_stride + iVar14] + (uint)mask[(uint)(iVar4 + iVar14)] + 2 >> 2;
        iVar14 = ((int)((uint)src1[uVar2] * (0x40 - uVar8) + src0[uVar15] * uVar8) >> 6) +
                 ((1 << (bVar5 & 0x1f)) >> 1) + iVar6;
        if (iVar14 >> (bVar5 & 0x1f) < 1) {
          iVar14 = 0;
        }
        iVar14 = iVar14 >> (bVar5 & 0x1f);
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        dst[uVar10] = (uint8_t)iVar14;
        uVar10 = uVar10 + 1;
        uVar2 = uVar2 + 1;
        uVar15 = uVar15 + 1;
      }
      iVar4 = iVar4 + iVar9;
      mask_stride = mask_stride + iVar9;
      uVar11 = uVar11 + dst_stride;
      uVar1 = uVar1 + src1_stride;
      uVar7 = uVar7 + src0_stride;
    }
  }
  else {
    iVar6 = ((1 << (bVar5 & 0x1f)) >> 1) + iVar6;
    uVar7 = 0;
    if (w < 1) {
      w = 0;
    }
    if (h < 1) {
      h = 0;
    }
    if ((subw ^ 1U) == 0 && subh == 0) {
      uVar13 = 0;
      uVar1 = 0;
      uVar11 = 0;
      uVar7 = 0;
      for (iVar9 = 0; uVar16 = (ulong)(uint)w, uVar2 = uVar1, uVar10 = uVar11, uVar8 = uVar13,
          uVar15 = uVar7, iVar9 != h; iVar9 = iVar9 + 1) {
        while( true ) {
          if (uVar16 == 0) break;
          uVar3 = (uint)mask[uVar15] + (uint)mask[uVar15 + 1] + 1 >> 1 & 0xff;
          iVar4 = ((int)((uint)src1[uVar2] * (0x40 - uVar3) + src0[uVar8] * uVar3) >> 6) + iVar6;
          if (iVar4 >> (bVar5 & 0x1f) < 1) {
            iVar4 = 0;
          }
          iVar4 = iVar4 >> (bVar5 & 0x1f);
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          dst[uVar10] = (uint8_t)iVar4;
          uVar16 = uVar16 - 1;
          uVar2 = uVar2 + 1;
          uVar10 = uVar10 + 1;
          uVar8 = uVar8 + 1;
          uVar15 = uVar15 + 2;
        }
        uVar7 = uVar7 + mask_stride;
        uVar11 = uVar11 + dst_stride;
        uVar1 = uVar1 + src1_stride;
        uVar13 = uVar13 + src0_stride;
      }
    }
    else {
      uVar11 = 0;
      uVar1 = 0;
      uVar13 = 0;
      for (iVar9 = 0; uVar16 = (ulong)(uint)w, uVar10 = uVar11, uVar8 = uVar13, uVar15 = uVar7,
          uVar2 = uVar1, iVar9 != h; iVar9 = iVar9 + 1) {
        while( true ) {
          if (uVar16 == 0) break;
          uVar3 = (uint)mask[uVar15] + (uint)mask[mask_stride + uVar15] + 1 >> 1 & 0xff;
          iVar4 = ((int)((uint)src1[uVar2] * (0x40 - uVar3) + src0[uVar10] * uVar3) >> 6) + iVar6;
          if (iVar4 >> (bVar5 & 0x1f) < 1) {
            iVar4 = 0;
          }
          iVar4 = iVar4 >> (bVar5 & 0x1f);
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          dst[uVar8] = (uint8_t)iVar4;
          uVar16 = uVar16 - 1;
          uVar10 = uVar10 + 1;
          uVar8 = uVar8 + 1;
          uVar15 = uVar15 + 1;
          uVar2 = uVar2 + 1;
        }
        uVar13 = uVar13 + dst_stride;
        uVar1 = uVar1 + src1_stride;
        uVar11 = uVar11 + src0_stride;
        uVar7 = uVar7 + mask_stride * 2;
      }
    }
  }
  return;
}

Assistant:

void aom_lowbd_blend_a64_d16_mask_c(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params) {
  int i, j;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = mask[i * mask_stride + j];
        res = ((m * (int32_t)src0[i * src0_stride + j] +
                (AOM_BLEND_A64_MAX_ALPHA - m) *
                    (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  } else if (subw == 1 && subh == 1) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = ROUND_POWER_OF_TWO(
            mask[(2 * i) * mask_stride + (2 * j)] +
                mask[(2 * i + 1) * mask_stride + (2 * j)] +
                mask[(2 * i) * mask_stride + (2 * j + 1)] +
                mask[(2 * i + 1) * mask_stride + (2 * j + 1)],
            2);
        res = ((m * (int32_t)src0[i * src0_stride + j] +
                (AOM_BLEND_A64_MAX_ALPHA - m) *
                    (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  } else if (subw == 1 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[i * mask_stride + (2 * j)],
                                    mask[i * mask_stride + (2 * j + 1)]);
        res = ((m * (int32_t)src0[i * src0_stride + j] +
                (AOM_BLEND_A64_MAX_ALPHA - m) *
                    (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[(2 * i) * mask_stride + j],
                                    mask[(2 * i + 1) * mask_stride + j]);
        res = ((int32_t)(m * (int32_t)src0[i * src0_stride + j] +
                         (AOM_BLEND_A64_MAX_ALPHA - m) *
                             (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  }
}